

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

MakeNet * __thiscall notch::core::MakeNet::addActivation(MakeNet *this,Activation *af)

{
  iterator __position;
  MakeLayer mk;
  LayerType local_4c;
  value_type local_48;
  
  checkConfig(this);
  local_48.nInputs = this->nOutputs;
  local_48.maybeWeights.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_48.maybeWeights.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48.maybeBias.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.maybeBias.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48.nOutputs = local_48.nInputs;
  local_48.maybeActivation = af;
  std::vector<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>::push_back
            (&this->layerMakers,&local_48);
  local_4c = FC;
  __position._M_current =
       (this->layerTypes).
       super__Vector_base<notch::core::MakeNet::LayerType,_std::allocator<notch::core::MakeNet::LayerType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->layerTypes).
      super__Vector_base<notch::core::MakeNet::LayerType,_std::allocator<notch::core::MakeNet::LayerType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<notch::core::MakeNet::LayerType,_std::allocator<notch::core::MakeNet::LayerType>_>::
    _M_realloc_insert<notch::core::MakeNet::LayerType>(&this->layerTypes,__position,&local_4c);
  }
  else {
    *__position._M_current = FC;
    (this->layerTypes).
    super__Vector_base<notch::core::MakeNet::LayerType,_std::allocator<notch::core::MakeNet::LayerType>_>
    ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  if (local_48.maybeBias.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.maybeBias.
               super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_48.maybeWeights.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.maybeWeights.
               super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return this;
}

Assistant:

MakeNet &addActivation(const Activation &af) {
        checkConfig();
        MakeLayer mk(nOutputs, af);
        layerMakers.push_back(mk);
        layerTypes.push_back(LayerType::FC);
        return *this;
    }